

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O0

DatatypeValidator * __thiscall
xercesc_4_0::DatatypeValidatorFactory::createDatatypeValidator
          (DatatypeValidatorFactory *this,XMLCh *typeName,DatatypeValidator *baseValidator,
          RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *facets,
          RefArrayVectorOf<char16_t> *enums,bool isDerivedByList,int finalSet,bool isUserDefined,
          MemoryManager *userManager)

{
  bool bVar1;
  ValidatorType VVar2;
  int iVar3;
  ORDERING ordered;
  KVStringPair *pKVar4;
  undefined4 extraout_var;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *this_00;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *this_01;
  MemoryManager *local_a8;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *baseFacets;
  KVStringPair *value;
  MemoryManager *manager;
  DatatypeValidator *datatypeValidator;
  Janitor<xercesc_4_0::RefArrayVectorOf<char16_t>_> janEnums;
  Janitor<xercesc_4_0::RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>_>
  janFacets;
  bool isUserDefined_local;
  bool isDerivedByList_local;
  RefArrayVectorOf<char16_t> *enums_local;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *facets_local;
  DatatypeValidator *baseValidator_local;
  XMLCh *typeName_local;
  DatatypeValidatorFactory *this_local;
  
  if (baseValidator == (DatatypeValidator *)0x0) {
    if (facets != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
      Janitor<xercesc_4_0::RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>_>::
      Janitor((Janitor<xercesc_4_0::RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>_>
               *)&janEnums,facets);
      Janitor<xercesc_4_0::RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>_>::
      ~Janitor((Janitor<xercesc_4_0::RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>_>
                *)&janEnums);
    }
    if (enums != (RefArrayVectorOf<char16_t> *)0x0) {
      Janitor<xercesc_4_0::RefArrayVectorOf<char16_t>_>::Janitor
                ((Janitor<xercesc_4_0::RefArrayVectorOf<char16_t>_> *)&datatypeValidator,enums);
      Janitor<xercesc_4_0::RefArrayVectorOf<char16_t>_>::~Janitor
                ((Janitor<xercesc_4_0::RefArrayVectorOf<char16_t>_> *)&datatypeValidator);
    }
    this_local = (DatatypeValidatorFactory *)0x0;
  }
  else {
    if (isUserDefined) {
      local_a8 = userManager;
    }
    else {
      local_a8 = XMLPlatformUtils::fgMemoryManager;
    }
    if (isDerivedByList) {
      manager = (MemoryManager *)XMemory::operator_new(0x98,local_a8);
      ListDatatypeValidator::ListDatatypeValidator
                ((ListDatatypeValidator *)manager,baseValidator,facets,enums,finalSet,local_a8);
      DatatypeValidator::setOrdered((DatatypeValidator *)manager,ORDERED_FALSE);
      DatatypeValidator::setNumeric((DatatypeValidator *)manager,false);
      if ((facets == (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) ||
         ((pKVar4 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                              (facets,SchemaSymbols::fgELT_LENGTH), pKVar4 == (KVStringPair *)0x0 &&
          ((pKVar4 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                               (facets,SchemaSymbols::fgELT_MINLENGTH),
           pKVar4 == (KVStringPair *)0x0 ||
           (pKVar4 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                               (facets,SchemaSymbols::fgELT_MAXLENGTH),
           pKVar4 == (KVStringPair *)0x0)))))) {
        DatatypeValidator::setBounded((DatatypeValidator *)manager,false);
        DatatypeValidator::setFinite((DatatypeValidator *)manager,false);
      }
      else {
        DatatypeValidator::setBounded((DatatypeValidator *)manager,true);
        DatatypeValidator::setFinite((DatatypeValidator *)manager,true);
      }
    }
    else {
      VVar2 = DatatypeValidator::getType(baseValidator);
      if (((VVar2 != String) &&
          (facets != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0))
         && (pKVar4 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                                (facets,SchemaSymbols::fgELT_WHITESPACE),
            pKVar4 != (KVStringPair *)0x0)) {
        RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::removeKey
                  (facets,SchemaSymbols::fgELT_WHITESPACE);
      }
      iVar3 = (*(baseValidator->super_XSerializable)._vptr_XSerializable[0xb])
                        (baseValidator,facets,enums,(ulong)(uint)finalSet,local_a8);
      manager = (MemoryManager *)CONCAT44(extraout_var,iVar3);
      ordered = DatatypeValidator::getOrdered(baseValidator);
      DatatypeValidator::setOrdered((DatatypeValidator *)manager,ordered);
      bVar1 = DatatypeValidator::getNumeric(baseValidator);
      DatatypeValidator::setNumeric((DatatypeValidator *)manager,bVar1);
      this_00 = DatatypeValidator::getFacets(baseValidator);
      if (((facets == (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0)
          || (((pKVar4 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                                   (facets,SchemaSymbols::fgELT_MININCLUSIVE),
               pKVar4 == (KVStringPair *)0x0 &&
               (pKVar4 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                                   (facets,SchemaSymbols::fgELT_MINEXCLUSIVE),
               pKVar4 == (KVStringPair *)0x0)) &&
              ((this_00 ==
                (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0 ||
               ((pKVar4 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                                    (this_00,SchemaSymbols::fgELT_MININCLUSIVE),
                pKVar4 == (KVStringPair *)0x0 &&
                (pKVar4 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                                    (this_00,SchemaSymbols::fgELT_MINEXCLUSIVE),
                pKVar4 == (KVStringPair *)0x0)))))))) ||
         ((pKVar4 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                              (facets,SchemaSymbols::fgELT_MAXINCLUSIVE),
          pKVar4 == (KVStringPair *)0x0 &&
          ((pKVar4 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                               (facets,SchemaSymbols::fgELT_MAXEXCLUSIVE),
           pKVar4 == (KVStringPair *)0x0 &&
           ((this_00 == (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0
            || ((pKVar4 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                                    (this_00,SchemaSymbols::fgELT_MAXINCLUSIVE),
                pKVar4 == (KVStringPair *)0x0 &&
                (pKVar4 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                                    (this_00,SchemaSymbols::fgELT_MAXEXCLUSIVE),
                pKVar4 == (KVStringPair *)0x0)))))))))) {
        DatatypeValidator::setBounded((DatatypeValidator *)manager,false);
      }
      else {
        DatatypeValidator::setBounded((DatatypeValidator *)manager,true);
      }
      bVar1 = DatatypeValidator::getFinite(baseValidator);
      if (bVar1) {
        DatatypeValidator::setFinite((DatatypeValidator *)manager,true);
      }
      else if (facets == (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0
              ) {
        DatatypeValidator::setFinite((DatatypeValidator *)manager,false);
      }
      else {
        pKVar4 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                           (facets,SchemaSymbols::fgELT_LENGTH);
        if (((pKVar4 == (KVStringPair *)0x0) &&
            (pKVar4 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                                (facets,SchemaSymbols::fgELT_MAXLENGTH),
            pKVar4 == (KVStringPair *)0x0)) &&
           (pKVar4 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                               (facets,SchemaSymbols::fgELT_TOTALDIGITS),
           pKVar4 == (KVStringPair *)0x0)) {
          bVar1 = DatatypeValidator::getBounded((DatatypeValidator *)manager);
          if (((bVar1) ||
              (VVar2 = DatatypeValidator::getType((DatatypeValidator *)manager), VVar2 == Date)) ||
             ((((VVar2 = DatatypeValidator::getType((DatatypeValidator *)manager),
                VVar2 == YearMonth ||
                ((VVar2 = DatatypeValidator::getType((DatatypeValidator *)manager), VVar2 == Year ||
                 (VVar2 = DatatypeValidator::getType((DatatypeValidator *)manager),
                 VVar2 == MonthDay)))) ||
               (VVar2 = DatatypeValidator::getType((DatatypeValidator *)manager), VVar2 == Day)) ||
              (VVar2 = DatatypeValidator::getType((DatatypeValidator *)manager), VVar2 == Month))))
          {
            pKVar4 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                               (facets,SchemaSymbols::fgELT_FRACTIONDIGITS);
            if (pKVar4 == (KVStringPair *)0x0) {
              DatatypeValidator::setFinite((DatatypeValidator *)manager,false);
            }
            else {
              DatatypeValidator::setFinite((DatatypeValidator *)manager,true);
            }
          }
          else {
            DatatypeValidator::setFinite((DatatypeValidator *)manager,false);
          }
        }
        else {
          DatatypeValidator::setFinite((DatatypeValidator *)manager,true);
        }
      }
    }
    if (manager != (MemoryManager *)0x0) {
      if (isUserDefined) {
        if (this->fUserDefinedRegistry ==
            (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)0x0) {
          this_01 = (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)
                    XMemory::operator_new(0x38,userManager);
          RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::RefHashTableOf
                    (this_01,0x1d,userManager);
          this->fUserDefinedRegistry = this_01;
        }
        RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
                  (this->fUserDefinedRegistry,typeName,(DatatypeValidator *)manager);
      }
      else {
        RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
                  (fBuiltInRegistry,typeName,(DatatypeValidator *)manager);
      }
      DatatypeValidator::setTypeName((DatatypeValidator *)manager,typeName);
    }
    this_local = (DatatypeValidatorFactory *)manager;
  }
  return (DatatypeValidator *)this_local;
}

Assistant:

DatatypeValidator* DatatypeValidatorFactory::createDatatypeValidator
(
      const XMLCh* const                  typeName
	, DatatypeValidator* const            baseValidator
    , RefHashTableOf<KVStringPair>* const facets
    , RefArrayVectorOf<XMLCh>* const      enums
    , const bool                          isDerivedByList
    , const int                           finalSet
    , const bool                          isUserDefined
    , MemoryManager* const                userManager
)
{
	if (baseValidator == 0) {

        if (facets) {
            Janitor<KVStringPairHashTable> janFacets(facets);
        }

        if (enums) {
            Janitor<XMLChRefVector> janEnums(enums);
        }

        return 0;
    }

	DatatypeValidator* datatypeValidator = 0;
    MemoryManager* const manager = (isUserDefined)
        ? userManager : XMLPlatformUtils::fgMemoryManager;

    if (isDerivedByList) {
        datatypeValidator = new (manager) ListDatatypeValidator(baseValidator, facets, enums, finalSet, manager);

        // Set PSVI information for Ordered, Numeric, Bounded & Finite
        datatypeValidator->setOrdered(XSSimpleTypeDefinition::ORDERED_FALSE);
        datatypeValidator->setNumeric(false);
        if (facets &&
             ((facets->get(SchemaSymbols::fgELT_LENGTH) ||
              (facets->get(SchemaSymbols::fgELT_MINLENGTH) && facets->get(SchemaSymbols::fgELT_MAXLENGTH)))))
        {
            datatypeValidator->setBounded(true);
            datatypeValidator->setFinite(true);
        }
        else
        {
            datatypeValidator->setBounded(false);
            datatypeValidator->setFinite(false);
        }
    }
    else {

        if ((baseValidator->getType() != DatatypeValidator::String) && facets) {

            KVStringPair* value = facets->get(SchemaSymbols::fgELT_WHITESPACE);

            if (value != 0) {
                facets->removeKey(SchemaSymbols::fgELT_WHITESPACE);
            }
        }

        datatypeValidator = baseValidator->newInstance
        (
            facets
            , enums
            , finalSet
            , manager
        );

        // Set PSVI information for Ordered, Numeric, Bounded & Finite
        datatypeValidator->setOrdered(baseValidator->getOrdered());
        datatypeValidator->setNumeric(baseValidator->getNumeric());
        RefHashTableOf<KVStringPair>* baseFacets = baseValidator->getFacets();
        if (facets  &&
            ((facets->get(SchemaSymbols::fgELT_MININCLUSIVE) ||
              facets->get(SchemaSymbols::fgELT_MINEXCLUSIVE) ||
              (baseFacets && (baseFacets->get(SchemaSymbols::fgELT_MININCLUSIVE) ||
                              baseFacets->get(SchemaSymbols::fgELT_MINEXCLUSIVE))))) &&
             (facets->get(SchemaSymbols::fgELT_MAXINCLUSIVE) ||
              facets->get(SchemaSymbols::fgELT_MAXEXCLUSIVE) ||
              (baseFacets && ((baseFacets->get(SchemaSymbols::fgELT_MAXINCLUSIVE) ||
                               baseFacets->get(SchemaSymbols::fgELT_MAXEXCLUSIVE))))))
        {
            datatypeValidator->setBounded(true);
        }
        else
        {
            datatypeValidator->setBounded(false);
        }
        if (baseValidator->getFinite())
        {
            datatypeValidator->setFinite(true);
        }
        else if (!facets)
        {
            datatypeValidator->setFinite(false);
        }
        else if (facets->get(SchemaSymbols::fgELT_LENGTH) || facets->get(SchemaSymbols::fgELT_MAXLENGTH) ||
                 facets->get(SchemaSymbols::fgELT_TOTALDIGITS))
        {
            datatypeValidator->setFinite(true);
        }
        //for efficiency use this instead of rechecking...
        //else if ((facets->get(SchemaSymbols::fgELT_MININCLUSIVE) || facets->get(SchemaSymbols::fgELT_MINEXCLUSIVE)) &&
        //         (facets->get(SchemaSymbols::fgELT_MAXINCLUSIVE) || facets->get(SchemaSymbols::fgELT_MAXEXCLUSIVE)))
        else if (datatypeValidator->getBounded() ||
                 datatypeValidator->getType() == DatatypeValidator::Date      ||
                 datatypeValidator->getType() == DatatypeValidator::YearMonth ||
                 datatypeValidator->getType() == DatatypeValidator::Year      ||
                 datatypeValidator->getType() == DatatypeValidator::MonthDay  ||
                 datatypeValidator->getType() == DatatypeValidator::Day       ||
                 datatypeValidator->getType() == DatatypeValidator::Month)
        {
            if (facets->get(SchemaSymbols::fgELT_FRACTIONDIGITS))
            {
                datatypeValidator->setFinite(true);
            }
            else
            {
                datatypeValidator->setFinite(false);
            }
        }
        else
        {
            datatypeValidator->setFinite(false);
        }
    }

    if (datatypeValidator != 0) {

        if (isUserDefined) {

            if (!fUserDefinedRegistry) {
                fUserDefinedRegistry = new (userManager) RefHashTableOf<DatatypeValidator>(29, userManager);
            }

            fUserDefinedRegistry->put((void *)typeName, datatypeValidator);
        }
        else {
            fBuiltInRegistry->put((void *)typeName, datatypeValidator);
        }

        datatypeValidator->setTypeName(typeName);
    }

    return datatypeValidator;
}